

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

int minliquid(monst *mtmp)

{
  permonst *ppVar1;
  bool bVar2;
  bool bVar3;
  boolean bVar4;
  boolean bVar5;
  boolean bVar6;
  uint uVar7;
  monst *pmVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  int tmp;
  int iVar12;
  bool bVar13;
  int iVar14;
  bool bVar15;
  
  if ((mtmp->data->mflags1 & 1) == 0) {
    bVar15 = mtmp->data->mlet != '\x05';
  }
  else {
    bVar15 = false;
  }
  bVar4 = is_pool(level,(int)mtmp->mx,(int)mtmp->my);
  bVar5 = is_lava(level,(int)mtmp->mx,(int)mtmp->my);
  bVar6 = is_swamp(level,(int)mtmp->mx,(int)mtmp->my);
  if (u.usteed == mtmp) {
    if (u.uprops[0x3c].extrinsic != 0) {
      return 0;
    }
    if (((youmonst.data)->mflags1 & 1) != 0) {
      return 0;
    }
    if (u.usteed == (monst *)0x0) {
      if (u.uprops[0x12].intrinsic != 0) {
        return 0;
      }
    }
    else if (((u.usteed)->data->mflags1 & 1) != 0 || u.uprops[0x12].intrinsic != 0) {
      return 0;
    }
    if (u.uprops[0x12].extrinsic != 0) {
      return 0;
    }
    if ((youmonst.data)->mlet == '\x05') {
      return 0;
    }
  }
  bVar13 = (bool)(bVar4 != '\0' & bVar15);
  bVar2 = (bool)(bVar6 != '\0' & bVar15);
  if (((mtmp->data == mons + 0x29) &&
      ((bool)(bVar15 & (bVar4 != '\0' || bVar6 != '\0')) ||
       level->locations[mtmp->mx][mtmp->my].typ == '\x1c')) &&
     (uVar7 = mt_random(), 0x55555555 < uVar7 * -0x55555555)) {
    pmVar8 = split_mon(mtmp,(monst *)0x0);
    if (pmVar8 != (monst *)0x0) {
      dryup(mtmp->mx,mtmp->my,'\0');
    }
    if (!bVar13) {
      return 0;
    }
LAB_001e41d7:
    water_damage(mtmp->minvent,'\0','\0');
    goto LAB_001e426d;
  }
  bVar3 = bVar2;
  if (bVar4 != '\0') {
    bVar3 = bVar15;
  }
  if (((mtmp->data == mons + 0x10a) && (bVar3)) &&
     (uVar7 = mt_random(), uVar7 * -0x33333333 < 0x33333334)) {
    iVar12 = 2;
    iVar14 = -2;
    do {
      uVar7 = mt_random();
      iVar12 = iVar12 + uVar7 % 6;
      iVar14 = iVar14 + 1;
    } while (iVar14 != 0);
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
      Monnam(mtmp);
      pline("%s rusts.");
    }
    iVar14 = mtmp->mhp - iVar12;
    mtmp->mhp = iVar14;
    iVar10 = mtmp->mhpmax - iVar12;
    if (iVar10 != 0 && iVar12 <= mtmp->mhpmax) {
      mtmp->mhpmax = iVar10;
    }
    if ((0 < iVar14) || (mondead_helper(mtmp,0), 0 < mtmp->mhp)) goto LAB_001e41d7;
LAB_001e4280:
    iVar12 = 1;
  }
  else {
    ppVar1 = mtmp->data;
    if ((bool)(bVar5 != '\0' & bVar15)) {
      if ((ppVar1 != mons + 0x157 && ppVar1 != mons + 0xa0) && (ppVar1->mflags1 & 0x10) == 0) {
        if ((mtmp->mintrinsics & 1) == 0) {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
            pcVar9 = Monnam(mtmp);
            pcVar11 = "burns to a crisp";
            if (mtmp->data == mons + 0xa2) {
              pcVar11 = "boils away";
            }
            pline("%s %s.",pcVar9,pcVar11);
          }
LAB_001e4233:
          mondead_helper(mtmp,0);
        }
        else {
          iVar12 = mtmp->mhp;
          mtmp->mhp = iVar12 + -1;
          if (iVar12 < 2) {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
              Monnam(mtmp);
              pline("%s surrenders to the fire.");
            }
            goto LAB_001e4233;
          }
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
            Monnam(mtmp);
            pline("%s burns slightly.");
          }
        }
        if (mtmp->mhp < 1) goto LAB_001e4280;
        fire_damage(mtmp->minvent,'\0','\0',mtmp->mx,mtmp->my);
        rloc(level,mtmp,'\0');
      }
    }
    else if (bVar13) {
      if ((ppVar1->mflags1 & 0x612) == 0) {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
          Monnam(mtmp);
          pline("%s drowns.");
        }
        if (((u.ustuck != (monst *)0x0) && (u.ustuck == mtmp)) && ((u._1052_1_ & 1) != 0)) {
          Monnam(mtmp);
          pline("%s sinks as water rushes in and flushes you out.");
        }
        mondead_helper(mtmp,0);
        if (mtmp->mhp < 1) goto LAB_001e4280;
        rloc(level,mtmp,'\0');
        goto LAB_001e41d7;
      }
    }
    else if (bVar2) {
      if ((ppVar1->mflags1 & 0x612) == 0) goto LAB_001e41d7;
    }
    else {
      if (ppVar1->mlet != '9') {
        return 0;
      }
      bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level);
      if (bVar4 != '\0') {
        return 0;
      }
      if (1 < mtmp->mhp) {
        mtmp->mhp = mtmp->mhp + -1;
      }
      monflee(mtmp,2,'\0','\0');
    }
LAB_001e426d:
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int minliquid(struct monst *mtmp)
{
    boolean inpool, inlava, inswamp, infountain, grounded;

    grounded = !is_flyer(mtmp->data) && !is_floater(mtmp->data);
    inpool = is_pool(level, mtmp->mx,mtmp->my) && grounded;
    inlava = is_lava(level, mtmp->mx,mtmp->my) && grounded;
    inswamp = is_swamp(level, mtmp->mx,mtmp->my) && grounded;
    infountain = IS_FOUNTAIN(level->locations[mtmp->mx][mtmp->my].typ);

	/* Flying and levitation keeps our steed out of the liquid */
	/* (but not water-walking or swimming) */
	if (mtmp == u.usteed && (Flying || Levitation))
		return 0;

    /* Gremlin multiplying won't go on forever since the hit points
     * keep going down, and when it gets to 1 hit point the clone
     * function will fail.
     */
    if (mtmp->data == &mons[PM_GREMLIN] && (inpool || infountain || inswamp) && rn2(3)) {
	if (split_mon(mtmp, NULL))
	    dryup(mtmp->mx, mtmp->my, FALSE);
	if (inpool) water_damage(mtmp->minvent, FALSE, FALSE);
	return 0;
    } else if (mtmp->data == &mons[PM_IRON_GOLEM] && (inpool || inswamp) && !rn2(5)) {
	int dam = dice(2,6);
	if (cansee(mtmp->mx,mtmp->my))
	    pline("%s rusts.", Monnam(mtmp));
	mtmp->mhp -= dam;
	if (mtmp->mhpmax > dam) mtmp->mhpmax -= dam;
	if (mtmp->mhp < 1) {
	    mondead(mtmp);
	    if (mtmp->mhp < 1) return 1;
	}
	water_damage(mtmp->minvent, FALSE, FALSE);
	return 0;
    }

    if (inlava) {
	/*
	 * Lava effects much as water effects. Lava likers are able to
	 * protect their stuff. Fire resistant monsters can only protect
	 * themselves  --ALI
	 */
	if (!is_clinger(mtmp->data) && !likes_lava(mtmp->data)) {
	    if (!resists_fire(mtmp)) {
		if (cansee(mtmp->mx,mtmp->my))
		    pline("%s %s.", Monnam(mtmp),
			  mtmp->data == &mons[PM_WATER_ELEMENTAL] ?
			  "boils away" : "burns to a crisp");
		mondead(mtmp);
	    }
	    else {
		if (--mtmp->mhp < 1) {
		    if (cansee(mtmp->mx,mtmp->my))
			pline("%s surrenders to the fire.", Monnam(mtmp));
		    mondead(mtmp);
		}
		else if (cansee(mtmp->mx,mtmp->my))
		    pline("%s burns slightly.", Monnam(mtmp));
	    }
	    if (mtmp->mhp > 0) {
		fire_damage(mtmp->minvent, FALSE, FALSE,
						mtmp->mx, mtmp->my);
		rloc(level, mtmp, FALSE);
		return 0;
	    }
	    return 1;
	}
    } else if (inpool) {
	/* Most monsters drown in pools.  flooreffects() will take care of
	 * water damage to dead monsters' inventory, but survivors need to
	 * be handled here.  Swimmers are able to protect their stuff...
	 */
	if (!is_clinger(mtmp->data)
	    && !is_swimmer(mtmp->data) && !amphibious(mtmp->data)) {
	    if (cansee(mtmp->mx,mtmp->my)) {
		    pline("%s drowns.", Monnam(mtmp));
	    }
	    if (u.ustuck && u.uswallow && u.ustuck == mtmp) {
	    /* This can happen after a purple worm plucks you off a
		flying steed while you are over water. */
		pline("%s sinks as water rushes in and flushes you out.",
			Monnam(mtmp));
	    }
	    mondead(mtmp);
	    if (mtmp->mhp > 0) {
		rloc(level, mtmp, FALSE);
		water_damage(mtmp->minvent, FALSE, FALSE);
		return 0;
	    }
	    return 1;
	}
    } else if (inswamp) {
	if (!is_clinger(mtmp->data)
	    && !is_swimmer(mtmp->data) && !amphibious(mtmp->data)) {
	    water_damage(mtmp->minvent, FALSE, FALSE);
	    return 0;
	}
    } else {
	/* but eels have a difficult time outside */
	if (mtmp->data->mlet == S_EEL && !Is_waterlevel(&u.uz)) {
	    if (mtmp->mhp > 1) mtmp->mhp--;
	    monflee(mtmp, 2, FALSE, FALSE);
	}
    }
    return 0;
}